

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::SerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *data;
  string *str;
  EnumValueDescriptorProto *this_00;
  uint8 *puVar4;
  EnumOptions *this_01;
  UnknownFieldSet *pUVar5;
  int local_dc;
  byte *pbStack_d8;
  int i;
  uint8 *target_local;
  EnumDescriptorProto *this_local;
  uint8 *local_40;
  byte *local_28;
  byte *local_10;
  
  bVar1 = has_name(this);
  pbStack_d8 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    str = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_40 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_40 = target + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    pbStack_d8 = io::CodedOutputStream::WriteStringToArray(str,puVar4);
  }
  for (local_dc = 0; iVar2 = value_size(this), local_dc < iVar2; local_dc = local_dc + 1) {
    this_00 = value(this,local_dc);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_d8 = (byte)uVar3;
      local_28 = pbStack_d8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_d8 = (byte)uVar3 | 0x80;
      pbStack_d8[1] = (byte)(uVar3 >> 7);
      local_28 = pbStack_d8 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_d8);
    }
    uVar3 = EnumValueDescriptorProto::GetCachedSize(this_00);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    pbStack_d8 = EnumValueDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar4);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    this_01 = options(this);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_d8 = (byte)uVar3;
      local_10 = pbStack_d8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_d8 = (byte)uVar3 | 0x80;
      pbStack_d8[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_d8 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_d8);
    }
    uVar3 = EnumOptions::GetCachedSize(this_01);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_d8 = EnumOptions::SerializeWithCachedSizesToArray(this_01,puVar4);
  }
  pUVar5 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar5);
  if (!bVar1) {
    pUVar5 = unknown_fields(this);
    pbStack_d8 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar5,pbStack_d8);
  }
  return pbStack_d8;
}

Assistant:

::google::protobuf::uint8* EnumDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (int i = 0; i < this->value_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->value(i), target);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}